

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

void sbs_substr(sbstring *sbs,ptrdiff_t pos,size_t len)

{
  char *__src;
  char *__dest;
  char *pcVar1;
  ulong __n;
  
  __dest = sbs->begin;
  pcVar1 = sbs->end;
  if ((long)sbs->end - (long)__dest < pos) {
    sbs->end = __dest;
    pcVar1 = __dest;
  }
  if (-1 < pos) {
    __src = __dest + pos;
    __n = (long)pcVar1 - (long)__src;
    if (len <= (ulong)((long)pcVar1 - (long)__src)) {
      __n = len;
    }
    if (__n == pos) {
      memcpy(__dest,__src,pos);
    }
    else {
      memmove(__dest,__src,__n);
    }
    sbs->end = sbs->begin + __n;
    sbs->begin[__n] = '\0';
  }
  return;
}

Assistant:

void sbs_substr(sbstring *sbs, ptrdiff_t pos, size_t len)
{
    if (pos > sbs->end - sbs->begin) {
        /* starting past end of string, do nothing */
        sbs->end = sbs->begin;
    }
    if (pos >= 0) {
        size_t sz = sbs->end - (sbs->begin + pos);
        if (len > sz) len = sz;
        if (len - pos > 0) {
            memmove(sbs->begin, sbs->begin + pos, len);
        }
        else {
            memcpy(sbs->begin, sbs->begin + pos, len);
        }
        sbs->end = sbs->begin + len;
        sbs->end[0] = '\0';
    }
}